

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::executeBFS(Executor *this)

{
  OpenList *this_00;
  uint uVar1;
  pointer psVar2;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  _Var3;
  difference_type __d;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator __position;
  ulong uVar7;
  Executor *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint local_b8;
  uint local_b4;
  undefined1 local_ad;
  uint rank;
  SharedPtr<Node> current;
  shared_ptr<Node> node;
  value_type local_88;
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  *local_78;
  SharedPtr<Node> local_70;
  Values local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  this_00 = &this->m_openList;
  local_78 = (vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->m_closedList;
  do {
    psVar2 = (this->m_openList).m_list.
             super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_openList).m_list.
        super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>._M_impl.
        super__Vector_impl_data._M_finish == psVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No solution found.\n> ",0x15);
      return;
    }
    current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar2->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar2->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    std::vector<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>::_M_erase
              (&this_00->m_list,
               (this_00->m_list).
               super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,
               &(current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_values);
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_78,&local_48);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_b8 = 0;
    if ((this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar12 = true;
    }
    else {
      uVar7 = 0;
      do {
        uVar1 = ((current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_values).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if (uVar1 == 0) {
          uVar10 = 6;
        }
        else {
          local_b4 = 0;
          puVar4 = (this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((this->m_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar4) {
            uVar7 = 0;
            do {
              if ((uint)uVar7 != local_b8) {
                uVar10 = 9;
                uVar11 = puVar4[uVar7] -
                         ((current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         m_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar7];
                if (uVar11 != 0) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                            (&local,&(current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_values);
                  if (uVar1 < uVar11) {
                    uVar11 = uVar1;
                  }
                  local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_b8] =
                       local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[local_b8] - uVar11;
                  local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_b4] =
                       local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start[local_b4] + uVar11;
                  _Var3 = std::
                          __find_if<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>>
                                    ((this->m_closedList).list.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (this->m_closedList).list.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local);
                  uVar10 = 9;
                  if (_Var3._M_current ==
                      (this->m_closedList).list.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    if ((long)local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0) {
                      rank = 0;
                    }
                    else {
                      uVar7 = 0;
                      rank = 0;
                      do {
                        iVar8 = local.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar7] -
                                (this->m_desired).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar7];
                        iVar9 = -iVar8;
                        if (0 < iVar8) {
                          iVar9 = iVar8;
                        }
                        rank = rank + iVar9;
                        uVar7 = uVar7 + 1;
                      } while ((uVar7 & 0xffffffff) <
                               (ulong)((long)local.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 2));
                    }
                    node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    this_01 = (Executor *)
                              &node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<Node,std::allocator<Node>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::shared_ptr<Node>const&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01,(Node **)&node,
                               (allocator<Node> *)&local_ad,&local,&current,&local_b8,&local_b4,
                               &rank);
                    if (rank == 0) {
                      local_70.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      local_70.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi;
                      if (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      showSolution(this_01,&local_70);
                      uVar10 = 1;
                      this_02._M_pi =
                           local_70.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
                    }
                    else {
                      local_88.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      local_88.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi;
                      if (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      __position._M_current =
                           (this->m_openList).m_list.
                           super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      uVar7 = (long)(this->m_openList).m_list.
                                    super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)__position._M_current >> 4;
                      if (0 < (long)uVar7) {
                        do {
                          uVar5 = uVar7 >> 1;
                          uVar6 = uVar5;
                          if ((__position._M_current[uVar5].
                               super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_rank
                              <= (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                 ->m_rank) {
                            uVar6 = ~uVar5 + uVar7;
                            __position._M_current = __position._M_current + uVar5 + 1;
                          }
                          uVar7 = uVar6;
                        } while (0 < (long)uVar6);
                      }
                      std::vector<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>::
                      _M_insert_rval(&this_00->m_list,__position,&local_88);
                      uVar10 = 0;
                      this_02._M_pi =
                           local_88.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
                    }
                    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
                    }
                    if (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                  }
                  if (local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if ((uVar10 != 9) && (uVar10 != 0)) goto LAB_00104211;
              }
              local_b4 = local_b4 + 1;
              uVar7 = (ulong)local_b4;
              puVar4 = (this->m_sizes).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (uVar7 < (ulong)((long)(this->m_sizes).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                    >> 2));
          }
          uVar10 = 7;
LAB_00104211:
          if (uVar10 == 7) {
            uVar10 = 0;
          }
        }
        if ((uVar10 != 6) && (uVar10 != 0)) goto LAB_00104253;
        local_b8 = local_b8 + 1;
        uVar7 = (ulong)local_b8;
      } while (uVar7 < (ulong)((long)(this->m_sizes).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_sizes).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2));
      uVar10 = 0;
LAB_00104253:
      bVar12 = (uVar10 & 0xb) == 0;
    }
    if (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (!bVar12) {
      return;
    }
  } while( true );
}

Assistant:

void Executor::executeBFS()
{
    while (!m_openList.isEmpty())
    {
        const auto current = m_openList.getFirst();

        m_openList.removeFirst();
        m_closedList.addLast(current->getValues());

        for (unsigned int j = 0; j < m_sizes.size(); j++)
        {
            const auto jValue = current->getValueAt(j);

            // I have nothing to move because unit is empty.
            if (jValue == 0)
                continue;

            for (unsigned int k = 0; k < m_sizes.size(); k++)
            {
                if (k == j)
                    continue;

                const auto kValue = current->getValueAt(k);

                // I cannot move anything here because target unit is full.
                if (kValue == m_sizes[k])
                    continue;

                // How much can I move to this unit.
                const auto capacity = m_sizes[k] - kValue;

                // How much is actually moved this iteration.
                const auto change = std::min(capacity, jValue);

                // Perform movement.
                auto local = current->getValues();
                local[j] -= change;
                local[k] += change;

                // Closed list check.
                if (m_closedList.contains(local))
                    continue;

                const auto rank = calculateRank(local);

                const auto node = std::make_shared<Node>(std::move(local), current, j, k, rank);

                if (rank == 0)
                {
                    showSolution(std::move(node));
                    return;
                }

                m_openList.addInPlace(std::move(node));
            }
        }
    }
    std::cout << "No solution found.\n> ";
}